

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::base::UnixSocket::SetTxTimeout(UnixSocket *this,uint32_t timeout_ms)

{
  uint __fd;
  ulong uVar1;
  int iVar2;
  _Base_ptr p_Var3;
  const_iterator __pos;
  _Base_ptr p_Var4;
  ulong *puVar5;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>,std::_Select1st<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>>
  *this_00;
  bool bVar6;
  tuple<> tStack_21;
  _Head_base<0UL,_const_unsigned_long_&,_false> a_Stack_20 [2];
  ulong local_10;
  ulong local_8;
  
  (this->sock_raw_).tx_timeout_ms_ = timeout_ms;
  local_10 = (ulong)timeout_ms / 1000;
  local_8 = (ulong)((timeout_ms % 1000) * 1000);
  __fd = (this->sock_raw_).fd_.t_;
  this_00 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>,std::_Select1st<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>>
             *)(ulong)__fd;
  puVar5 = (ulong *)0x1;
  a_Stack_20[0]._M_head_impl = (unsigned_long *)0x2f8457;
  iVar2 = setsockopt(__fd,1,0x15,&local_10,0x10);
  if (iVar2 == 0) {
    return;
  }
  a_Stack_20[0]._M_head_impl = (unsigned_long *)0x2f8465;
  SetTxTimeout();
  p_Var4 = *(_Base_ptr *)(this_00 + 0x10);
  __pos._M_node = (_Base_ptr)(this_00 + 8);
  if (p_Var4 != (_Base_ptr)0x0) {
    uVar1 = *puVar5;
    p_Var3 = __pos._M_node;
    do {
      if (*(ulong *)(p_Var4 + 1) >= uVar1) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < uVar1];
    } while (p_Var4 != (_Base_ptr)0x0);
    bVar6 = p_Var3 != __pos._M_node;
    __pos._M_node = p_Var3;
    if ((bVar6) && (*(ulong *)(p_Var3 + 1) <= uVar1)) {
      return;
    }
  }
  a_Stack_20[0]._M_head_impl = puVar5;
  ::std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>,std::_Select1st<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,std::default_delete<perfetto::ipc::HostImpl::ClientConnection>>>>>
  ::
  _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
            (this_00,__pos,(piecewise_construct_t *)&::std::piecewise_construct,
             (tuple<const_unsigned_long_&> *)a_Stack_20,&tStack_21);
  return;
}

Assistant:

void SetTxTimeout(uint32_t timeout_ms) {
    PERFETTO_CHECK(sock_raw_.SetTxTimeout(timeout_ms));
  }